

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_0::CWriter::WriteInfixBinaryExpr
          (CWriter *this,Opcode opcode,char *op,AssignOp assign_op)

{
  Newline local_7d;
  Type local_7c;
  StackVar local_74;
  Type local_68;
  StackVar local_60;
  Type local_54;
  StackVar local_4c;
  Type local_40;
  StackVar local_38;
  Type local_2c;
  Type result_type;
  AssignOp assign_op_local;
  char *op_local;
  CWriter *this_local;
  Opcode opcode_local;
  
  result_type.enum_ = assign_op;
  unique0x1000023d = op;
  this_local._4_4_ = opcode.enum_;
  local_40 = Opcode::GetResultType((Opcode *)((long)&this_local + 4));
  local_2c = local_40;
  StackVar::StackVar(&local_38,1,local_40);
  Write(this,&local_38);
  if (result_type.enum_ == ~I64) {
    Type::Type(&local_54,Any);
    StackVar::StackVar(&local_4c,0,local_54);
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[2],char_const*&,char_const(&)[3],wabt::(anonymous_namespace)::StackVar>
              ((CWriter *)this,(char (*) [2])0x234f67,(char **)&result_type.type_index_,
               (char (*) [3])0x239348,&local_4c);
  }
  else {
    Type::Type(&local_68,Any);
    StackVar::StackVar(&local_60,1,local_68);
    Type::Type(&local_7c,Any);
    StackVar::StackVar(&local_74,0,local_7c);
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[4],wabt::(anonymous_namespace)::StackVar,char_const(&)[2],char_const*&,char_const(&)[2],wabt::(anonymous_namespace)::StackVar>
              ((CWriter *)this,(char (*) [4])0x239347,&local_60,(char (*) [2])0x234f67,
               (char **)&result_type.type_index_,(char (*) [2])0x234f67,&local_74);
  }
  (anonymous_namespace)::CWriter::Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [2])0x238bef,&local_7d);
  DropTypes(this,2);
  PushType(this,local_2c);
  return;
}

Assistant:

void CWriter::WriteInfixBinaryExpr(Opcode opcode,
                                   const char* op,
                                   AssignOp assign_op) {
  Type result_type = opcode.GetResultType();
  Write(StackVar(1, result_type));
  if (assign_op == AssignOp::Allowed) {
    Write(" ", op, "= ", StackVar(0));
  } else {
    Write(" = ", StackVar(1), " ", op, " ", StackVar(0));
  }
  Write(";", Newline());
  DropTypes(2);
  PushType(result_type);
}